

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmInstructionTests.cpp
# Opt level: O0

string * __thiscall
vkt::SpirVAssembly::getTypeName_abi_cxx11_
          (string *__return_storage_ptr__,SpirVAssembly *this,IntegerType type)

{
  bool bVar1;
  char *__s;
  IntegerType type_00;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  allocator<char> local_39;
  undefined1 local_38 [8];
  string prefix;
  IntegerType type_local;
  
  prefix.field_2._12_4_ = SUB84(this,0);
  bVar1 = isSigned(prefix.field_2._12_4_);
  __s = "u";
  if (bVar1) {
    __s = "";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_38,__s,&local_39);
  std::allocator<char>::~allocator(&local_39);
  std::operator+(&local_70,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,"int"
                );
  getBitWidthStr_abi_cxx11_(&local_90,(SpirVAssembly *)(ulong)(uint)prefix.field_2._12_4_,type_00);
  std::operator+(__return_storage_ptr__,&local_70,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)local_38);
  return __return_storage_ptr__;
}

Assistant:

const string getTypeName (IntegerType type)
{
	string prefix = isSigned(type) ? "" : "u";
	return prefix + "int" + getBitWidthStr(type);
}